

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O3

int pageant_enum_keys(pageant_key_enum_fn_t callback,void *callback_ctx,char **retstr)

{
  pageant_key_enum_fn_t p_Var1;
  KeyList *kl;
  char *pcVar2;
  KeyList *kl_00;
  char **ppcVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  ptrlen string;
  ptrlen pl;
  ptrlen string_00;
  ptrlen pl_00;
  ptrlen blob;
  pageant_pubkey cbkey;
  BinarySource src [1];
  RSAKey rkey;
  pageant_pubkey local_d0;
  pageant_key_enum_fn_t local_b8;
  void *local_b0;
  BinarySource local_a8;
  RSAKey local_78;
  
  kl = pageant_get_keylist(1);
  if ((kl == (KeyList *)0x0) || (kl->broken != true)) {
    kl_00 = pageant_get_keylist(2);
    if ((kl_00 == (KeyList *)0x0) || (kl_00->broken != true)) {
      local_b8 = callback;
      local_b0 = callback_ctx;
      if ((kl != (KeyList *)0x0) && (kl->nkeys != 0)) {
        lVar5 = 0;
        uVar6 = 0;
        do {
          string.len = *(size_t *)((long)&(kl->keys->blob).len + lVar5);
          string.ptr = *(void **)((long)&(kl->keys->blob).ptr + lVar5);
          local_d0.blob = strbuf_dup(string);
          pl.len = *(size_t *)((long)&(kl->keys->comment).len + lVar5);
          pl.ptr = *(void **)((long)&(kl->keys->comment).ptr + lVar5);
          local_d0.comment = mkstr(pl);
          local_d0.ssh_version = 1;
          local_78.sshk.vt = (ssh_keyalg *)0x0;
          local_78.iqmp = (mp_int *)0x0;
          local_78.comment = (char *)0x0;
          local_78.p = (mp_int *)0x0;
          local_78.q = (mp_int *)0x0;
          local_78.exponent = (mp_int *)0x0;
          local_78.private_exponent = (mp_int *)0x0;
          local_78.bits = 0;
          local_78.bytes = 0;
          local_78.modulus = (mp_int *)0x0;
          local_a8.data = *(void **)((long)&(kl->keys->blob).ptr + lVar5);
          local_a8.len = *(size_t *)((long)&(kl->keys->blob).len + lVar5);
          local_a8.pos = 0;
          local_a8.err = BSE_NO_ERROR;
          local_a8.binarysource_ = &local_a8;
          BinarySource_get_rsa_ssh1_pub(local_a8.binarysource_,&local_78,RSA_SSH1_EXPONENT_FIRST);
          if ((local_a8.binarysource_)->err != BSE_NO_ERROR) {
            pcVar2 = dupstr("Received an invalid SSH-1 key from agent");
            *retstr = pcVar2;
            iVar4 = 1;
            goto LAB_001151ec;
          }
          ppcVar3 = rsa_ssh1_fake_all_fingerprints(&local_78);
          freersakey(&local_78);
          (*local_b8)(local_b0,ppcVar3,local_d0.comment,
                      *(uint32_t *)((long)&kl->keys->flags + lVar5),&local_d0);
          strbuf_free(local_d0.blob);
          safefree(local_d0.comment);
          ssh2_free_all_fingerprints(ppcVar3);
          uVar6 = uVar6 + 1;
          lVar5 = lVar5 + 0x28;
        } while (uVar6 < kl->nkeys);
      }
      p_Var1 = local_b8;
      if ((kl_00 == (KeyList *)0x0) || (kl_00->nkeys == 0)) {
        pcVar2 = (char *)0x0;
        iVar4 = 0;
      }
      else {
        lVar5 = 0;
        uVar6 = 0;
        do {
          string_00.len = *(size_t *)((long)&(kl_00->keys->blob).len + lVar5);
          string_00.ptr = *(void **)((long)&(kl_00->keys->blob).ptr + lVar5);
          local_d0.blob = strbuf_dup(string_00);
          pl_00.len = *(size_t *)((long)&(kl_00->keys->comment).len + lVar5);
          pl_00.ptr = *(void **)((long)&(kl_00->keys->comment).ptr + lVar5);
          local_d0.comment = mkstr(pl_00);
          local_d0.ssh_version = 2;
          blob.len = *(size_t *)((long)&(kl_00->keys->blob).len + lVar5);
          blob.ptr = *(void **)((long)&(kl_00->keys->blob).ptr + lVar5);
          ppcVar3 = ssh2_all_fingerprints_for_blob(blob);
          (*p_Var1)(local_b0,ppcVar3,local_d0.comment,
                    *(uint32_t *)((long)&kl_00->keys->flags + lVar5),&local_d0);
          ssh2_free_all_fingerprints(ppcVar3);
          safefree(local_d0.comment);
          strbuf_free(local_d0.blob);
          uVar6 = uVar6 + 1;
          lVar5 = lVar5 + 0x28;
        } while (uVar6 < kl_00->nkeys);
        pcVar2 = (char *)0x0;
        iVar4 = 0;
      }
    }
    else {
      pcVar2 = dupstr("Received broken SSH-2 key list from agent");
      iVar4 = 1;
    }
    *retstr = pcVar2;
    if (kl == (KeyList *)0x0) goto LAB_001151f4;
  }
  else {
    pcVar2 = dupstr("Received broken SSH-1 key list from agent");
    *retstr = pcVar2;
    iVar4 = 1;
    kl_00 = (KeyList *)0x0;
  }
LAB_001151ec:
  keylist_free(kl);
LAB_001151f4:
  if (kl_00 != (KeyList *)0x0) {
    keylist_free(kl_00);
  }
  return iVar4;
}

Assistant:

int pageant_enum_keys(pageant_key_enum_fn_t callback, void *callback_ctx,
                      char **retstr)
{
    KeyList *kl1 = NULL, *kl2 = NULL;
    struct pageant_pubkey cbkey;
    int toret = PAGEANT_ACTION_FAILURE;

    kl1 = pageant_get_keylist(1);
    if (kl1 && kl1->broken) {
        *retstr = dupstr("Received broken SSH-1 key list from agent");
        goto out;
    }

    kl2 = pageant_get_keylist(2);
    if (kl2 && kl2->broken) {
        *retstr = dupstr("Received broken SSH-2 key list from agent");
        goto out;
    }

    if (kl1) {
        for (size_t i = 0; i < kl1->nkeys; i++) {
            cbkey.blob = strbuf_dup(kl1->keys[i].blob);
            cbkey.comment = mkstr(kl1->keys[i].comment);
            cbkey.ssh_version = 1;

            /* Decode public blob into a key in order to fingerprint it */
            RSAKey rkey;
            memset(&rkey, 0, sizeof(rkey));
            {
                BinarySource src[1];
                BinarySource_BARE_INIT_PL(src, kl1->keys[i].blob);
                get_rsa_ssh1_pub(src, &rkey, RSA_SSH1_EXPONENT_FIRST);
                if (get_err(src)) {
                    *retstr = dupstr(
                        "Received an invalid SSH-1 key from agent");
                    goto out;
                }
            }
            char **fingerprints = rsa_ssh1_fake_all_fingerprints(&rkey);
            freersakey(&rkey);

            callback(callback_ctx, fingerprints, cbkey.comment,
                     kl1->keys[i].flags, &cbkey);

            strbuf_free(cbkey.blob);
            sfree(cbkey.comment);
            ssh2_free_all_fingerprints(fingerprints);
        }
    }

    if (kl2) {
        for (size_t i = 0; i < kl2->nkeys; i++) {
            cbkey.blob = strbuf_dup(kl2->keys[i].blob);
            cbkey.comment = mkstr(kl2->keys[i].comment);
            cbkey.ssh_version = 2;

            char **fingerprints =
                ssh2_all_fingerprints_for_blob(kl2->keys[i].blob);

            callback(callback_ctx, fingerprints, cbkey.comment,
                     kl2->keys[i].flags, &cbkey);

            ssh2_free_all_fingerprints(fingerprints);
            sfree(cbkey.comment);
            strbuf_free(cbkey.blob);
        }
    }

    *retstr = NULL;
    toret = PAGEANT_ACTION_OK;
  out:
    if (kl1)
        keylist_free(kl1);
    if (kl2)
        keylist_free(kl2);
    return toret;
}